

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O0

bool __thiscall CfgNode::addSuccessor(CfgNode *this,CfgNode *succ)

{
  Type TVar1;
  bool bVar2;
  pair<std::_Rb_tree_const_iterator<CfgNode::Edge>,_bool> pVar3;
  Edge local_38;
  _Base_ptr local_28;
  byte local_20;
  CfgNode *local_18;
  CfgNode *succ_local;
  CfgNode *this_local;
  
  local_18 = succ;
  succ_local = this;
  TVar1 = type(this);
  bVar2 = false;
  if (TVar1 != CFG_EXIT) {
    TVar1 = type(this);
    bVar2 = TVar1 != CFG_HALT;
  }
  if (!bVar2) {
    __assert_fail("this->type() != CfgNode::CFG_EXIT && this->type() != CfgNode::CFG_HALT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CfgNode.cpp"
                  ,0x48,"bool CfgNode::addSuccessor(CfgNode *)");
  }
  TVar1 = type(local_18);
  if (TVar1 != CFG_ENTRY) {
    Edge::Edge(&local_38,local_18);
    pVar3 = std::set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>::
            insert(&this->m_succs,&local_38);
    local_28 = (_Base_ptr)pVar3.first._M_node;
    local_20 = pVar3.second;
    Edge::~Edge(&local_38);
    return (bool)(pVar3.second & 1);
  }
  __assert_fail("succ->type() != CfgNode::CFG_ENTRY",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CfgNode.cpp"
                ,0x49,"bool CfgNode::addSuccessor(CfgNode *)");
}

Assistant:

bool CfgNode::addSuccessor(CfgNode* succ) {
	assert(this->type() != CfgNode::CFG_EXIT && this->type() != CfgNode::CFG_HALT);
	assert(succ->type() != CfgNode::CFG_ENTRY);

	return m_succs.insert(CfgNode::Edge(succ)).second;
}